

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void bin_linear(IntVar *x,IntVar *y,IntRelType t,int c)

{
  char *pcVar1;
  int in_ECX;
  undefined4 in_EDX;
  IntVar *in_RSI;
  IntVar *in_RDI;
  vec<IntVar_*> vars;
  vec<int> coeffs;
  BoolView *in_stack_000002f0;
  IntView<0> in_stack_000002f8;
  IntView<0> in_stack_00000308;
  undefined2 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff22;
  IntVar **in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff32;
  undefined8 in_stack_ffffffffffffff38;
  uint _sz;
  vec<int> *in_stack_ffffffffffffff40;
  FILE *pFVar2;
  char *local_b0;
  vec<IntVar_*> local_80;
  undefined4 local_6c;
  longdouble in_stack_ffffffffffffffa0;
  longdouble in_stack_ffffffffffffffb0;
  vec<IntVar_*> *in_stack_ffffffffffffffc0;
  IntVar *in_stack_ffffffffffffffc8;
  MIP *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe0;
  IntRelType in_stack_ffffffffffffffe4;
  
  pFVar2 = _stderr;
  _sz = (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  switch(in_EDX) {
  case 0:
    bin_linear(in_RSI,(IntVar *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0);
    bin_linear(in_RSI,(IntVar *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0);
    break;
  default:
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      local_b0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                         ,0x2f);
      local_b0 = local_b0 + 1;
    }
    fprintf(pFVar2,"%s:%d: ",local_b0,0xec);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  case 2:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffd8,in_RDI,-1,in_ECX);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffc8,in_RSI,1,0);
    newBinGE(in_stack_00000308,in_stack_000002f8,in_stack_000002f0);
    break;
  case 3:
    bin_linear(in_RSI,(IntVar *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0);
    break;
  case 4:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffb8,in_RDI,1,0);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffa8,in_RSI,-1,in_ECX);
    newBinGE(in_stack_00000308,in_stack_000002f8,in_stack_000002f0);
    break;
  case 5:
    bin_linear(in_RSI,(IntVar *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0);
  }
  local_6c = 1;
  vec<int>::vec(in_stack_ffffffffffffff40,_sz,
                (int *)CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30));
  vec<IntVar_*>::vec(&local_80);
  vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30)
                      ,in_stack_ffffffffffffff28);
  vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30)
                      ,in_stack_ffffffffffffff28);
  switch(in_EDX) {
  case 0:
    break;
  default:
    pFVar2 = _stderr;
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                       ,0x2f);
      pcVar1 = pcVar1 + 1;
    }
    fprintf(pFVar2,"%s:%d: ",pcVar1,0x103);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  case 2:
    in_stack_ffffffffffffff20 = (undefined2)((unkuint10)(longdouble)-1e+100 >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffffd0,(vec<int> *)in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0
                      );
    break;
  case 3:
    break;
  case 4:
    in_stack_ffffffffffffff20 = (undefined2)((unkuint10)(longdouble)in_ECX >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffffd0,(vec<int> *)in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0
                      );
    break;
  case 5:
  }
  vec<IntVar_*>::~vec((vec<IntVar_*> *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)
                     );
  vec<int>::~vec((vec<int> *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void bin_linear(IntVar* x, IntVar* y, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			bin_linear(x, y, IRT_LE, c);
			bin_linear(x, y, IRT_GE, c);
			break;
		case IRT_LE:
			// x + y <= c <=> (-x+c) >= y
			newBinGE(IntView<>(x, -1, c), IntView<>(y));
			break;
		case IRT_LT:
			bin_linear(x, y, IRT_LE, c - 1);
			break;
		case IRT_GE:
			// x + y >= c <=> x >= (-y+c)
			newBinGE(IntView<>(x), IntView<>(y, -1, c));
			break;
		case IRT_GT:
			bin_linear(x, y, IRT_GE, c + 1);
			break;
		default:
			NEVER;
	}

	vec<int> coeffs(2, 1);
	vec<IntVar*> vars;

	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			break;
		default:
			NEVER;
	}
}